

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdtarga.c
# Opt level: O0

void start_input_tga(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  undefined8 uVar5;
  long in_RSI;
  long *in_RDI;
  cd_progress_ptr progress;
  boolean is_bottom_up;
  uint maplen;
  uint height;
  uint width;
  int components;
  int interlace_type;
  int flags;
  int subtype;
  int cmaptype;
  int idlen;
  U_CHAR targaheader [18];
  tga_source_ptr source;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  int local_50;
  uint local_44;
  uint local_3c;
  byte local_38;
  byte local_37;
  byte local_36;
  byte local_35;
  byte local_34;
  byte local_33;
  byte local_32;
  byte local_2c;
  byte local_2b;
  byte local_2a;
  byte local_29;
  byte local_28;
  byte local_27;
  long local_18;
  long *local_8;
  
  local_18 = in_RSI;
  local_8 = in_RDI;
  sVar4 = fread(&local_38,1,0x12,*(FILE **)(in_RSI + 0x18));
  if (sVar4 != 0x12) {
    *(undefined4 *)(*local_8 + 0x28) = 0x2b;
    (**(code **)*local_8)(local_8);
  }
  if (local_28 == 0xf) {
    local_28 = 0x10;
  }
  local_3c = (uint)local_38;
  local_44 = (uint)local_36;
  uVar1 = (uint)local_33 + (uint)local_32 * 0x100;
  iVar2 = (uint)local_2c + (uint)local_2b * 0x100;
  iVar3 = (uint)local_2a + (uint)local_29 * 0x100;
  *(int *)(local_18 + 0x5c) = (int)(uint)local_28 >> 3;
  if (((((1 < local_37) || (*(int *)(local_18 + 0x5c) < 1)) || (4 < *(int *)(local_18 + 0x5c))) ||
      (((local_28 & 7) != 0 || ((int)(uint)local_27 >> 6 != 0)))) || ((iVar2 == 0 || (iVar3 == 0))))
  {
    *(undefined4 *)(*local_8 + 0x28) = 0x40d;
    (**(code **)*local_8)(local_8);
  }
  if (local_44 < 9) {
    *(code **)(local_18 + 0x50) = read_non_rle_pixel;
  }
  else {
    *(code **)(local_18 + 0x50) = read_rle_pixel;
    *(undefined4 *)(local_18 + 0x68) = 0;
    *(undefined4 *)(local_18 + 100) = 0;
    local_44 = local_44 - 8;
  }
  local_50 = 3;
  *(undefined4 *)((long)local_8 + 0x3c) = 2;
  if (local_44 == 1) {
    if ((*(int *)(local_18 + 0x5c) == 1) && (local_37 == 1)) {
      *(code **)(local_18 + 0x70) = get_8bit_row;
    }
    else {
      *(undefined4 *)(*local_8 + 0x28) = 0x40d;
      (**(code **)*local_8)(local_8);
    }
    *(undefined4 *)(*local_8 + 0x28) = 0x411;
    *(int *)(*local_8 + 0x2c) = iVar2;
    *(int *)(*local_8 + 0x30) = iVar3;
    (**(code **)(*local_8 + 8))(local_8,1);
  }
  else if (local_44 == 2) {
    in_stack_ffffffffffffff90 = *(int *)(local_18 + 0x5c);
    if (in_stack_ffffffffffffff90 == 2) {
      *(code **)(local_18 + 0x70) = get_16bit_row;
    }
    else if (in_stack_ffffffffffffff90 == 3) {
      *(code **)(local_18 + 0x70) = get_24bit_row;
    }
    else if (in_stack_ffffffffffffff90 == 4) {
      *(code **)(local_18 + 0x70) = get_24bit_row;
    }
    else {
      *(undefined4 *)(*local_8 + 0x28) = 0x40d;
      (**(code **)*local_8)(local_8);
    }
    *(undefined4 *)(*local_8 + 0x28) = 0x40f;
    *(int *)(*local_8 + 0x2c) = iVar2;
    *(int *)(*local_8 + 0x30) = iVar3;
    (**(code **)(*local_8 + 8))(local_8,1);
  }
  else if (local_44 == 3) {
    local_50 = 1;
    *(undefined4 *)((long)local_8 + 0x3c) = 1;
    if (*(int *)(local_18 + 0x5c) == 1) {
      *(code **)(local_18 + 0x70) = get_8bit_gray_row;
    }
    else {
      *(undefined4 *)(*local_8 + 0x28) = 0x40d;
      (**(code **)*local_8)(local_8);
    }
    *(undefined4 *)(*local_8 + 0x28) = 0x410;
    *(int *)(*local_8 + 0x2c) = iVar2;
    *(int *)(*local_8 + 0x30) = iVar3;
    (**(code **)(*local_8 + 8))(local_8,1);
  }
  else {
    *(undefined4 *)(*local_8 + 0x28) = 0x40d;
    (**(code **)*local_8)(local_8);
  }
  if ((local_27 & 0x20) == 0) {
    uVar5 = (**(code **)(local_8[1] + 0x20))(local_8,1,0,iVar2 * local_50,iVar3);
    *(undefined8 *)(local_18 + 0x40) = uVar5;
    if (local_8[2] != 0) {
      *(int *)(local_8[2] + 0x24) = *(int *)(local_8[2] + 0x24) + 1;
    }
    *(undefined4 *)(local_18 + 0x28) = 1;
    *(code **)(local_18 + 8) = preload_image;
  }
  else {
    *(undefined8 *)(local_18 + 0x40) = 0;
    uVar5 = (**(code **)(local_8[1] + 0x10))(local_8,1,iVar2 * local_50);
    *(undefined8 *)(local_18 + 0x20) = uVar5;
    *(undefined4 *)(local_18 + 0x28) = 1;
    *(undefined8 *)(local_18 + 8) = *(undefined8 *)(local_18 + 0x70);
  }
  while (local_3c != 0) {
    read_byte((tga_source_ptr)CONCAT44(local_44,in_stack_ffffffffffffff90));
    local_3c = local_3c - 1;
  }
  if (uVar1 == 0) {
    if (local_37 != 0) {
      *(undefined4 *)(*local_8 + 0x28) = 0x40d;
      (**(code **)*local_8)(local_8);
    }
    *(undefined8 *)(local_18 + 0x38) = 0;
    *(undefined4 *)(local_18 + 0x60) = 0;
  }
  else {
    if ((0x100 < uVar1) || ((uint)local_35 + (uint)local_34 * 0x100 != 0)) {
      *(undefined4 *)(*local_8 + 0x28) = 0x40c;
      (**(code **)*local_8)(local_8);
    }
    uVar5 = (**(code **)(local_8[1] + 0x10))(local_8,1,uVar1,3);
    *(undefined8 *)(local_18 + 0x38) = uVar5;
    *(uint *)(local_18 + 0x60) = uVar1;
    read_colormap((tga_source_ptr)CONCAT44(local_44,in_stack_ffffffffffffff90),
                  in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
  }
  *(int *)(local_8 + 7) = local_50;
  *(undefined4 *)(local_8 + 9) = 8;
  *(int *)(local_8 + 6) = iVar2;
  *(int *)((long)local_8 + 0x34) = iVar3;
  return;
}

Assistant:

METHODDEF(void)
start_input_tga(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
{
  tga_source_ptr source = (tga_source_ptr)sinfo;
  U_CHAR targaheader[18];
  int idlen, cmaptype, subtype, flags, interlace_type, components;
  unsigned int width, height, maplen;
  boolean is_bottom_up;

#define GET_2B(offset) \
  ((unsigned int)UCH(targaheader[offset]) + \
   (((unsigned int)UCH(targaheader[offset + 1])) << 8))

  if (!ReadOK(source->pub.input_file, targaheader, 18))
    ERREXIT(cinfo, JERR_INPUT_EOF);

  /* Pretend "15-bit" pixels are 16-bit --- we ignore attribute bit anyway */
  if (targaheader[16] == 15)
    targaheader[16] = 16;

  idlen = UCH(targaheader[0]);
  cmaptype = UCH(targaheader[1]);
  subtype = UCH(targaheader[2]);
  maplen = GET_2B(5);
  width = GET_2B(12);
  height = GET_2B(14);
  source->pixel_size = UCH(targaheader[16]) >> 3;
  flags = UCH(targaheader[17]); /* Image Descriptor byte */

  is_bottom_up = ((flags & 0x20) == 0); /* bit 5 set => top-down */
  interlace_type = flags >> 6;  /* bits 6/7 are interlace code */

  if (cmaptype > 1 ||           /* cmaptype must be 0 or 1 */
      source->pixel_size < 1 || source->pixel_size > 4 ||
      (UCH(targaheader[16]) & 7) != 0 || /* bits/pixel must be multiple of 8 */
      interlace_type != 0 ||      /* currently don't allow interlaced image */
      width == 0 || height == 0)  /* image width/height must be non-zero */
    ERREXIT(cinfo, JERR_TGA_BADPARMS);
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
  if (sinfo->max_pixels &&
      (unsigned long long)width * height > sinfo->max_pixels)
    ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);
#endif

  if (subtype > 8) {
    /* It's an RLE-coded file */
    source->read_pixel = read_rle_pixel;
    source->block_count = source->dup_pixel_count = 0;
    subtype -= 8;
  } else {
    /* Non-RLE file */
    source->read_pixel = read_non_rle_pixel;
  }

  /* Now should have subtype 1, 2, or 3 */
  components = 3;               /* until proven different */
  cinfo->in_color_space = JCS_RGB;

  switch (subtype) {
  case 1:                       /* Colormapped image */
    if (source->pixel_size == 1 && cmaptype == 1)
      source->get_pixel_rows = get_8bit_row;
    else
      ERREXIT(cinfo, JERR_TGA_BADPARMS);
    TRACEMS2(cinfo, 1, JTRC_TGA_MAPPED, width, height);
    break;
  case 2:                       /* RGB image */
    switch (source->pixel_size) {
    case 2:
      source->get_pixel_rows = get_16bit_row;
      break;
    case 3:
      source->get_pixel_rows = get_24bit_row;
      break;
    case 4:
      source->get_pixel_rows = get_32bit_row;
      break;
    default:
      ERREXIT(cinfo, JERR_TGA_BADPARMS);
      break;
    }
    TRACEMS2(cinfo, 1, JTRC_TGA, width, height);
    break;
  case 3:                       /* Grayscale image */
    components = 1;
    cinfo->in_color_space = JCS_GRAYSCALE;
    if (source->pixel_size == 1)
      source->get_pixel_rows = get_8bit_gray_row;
    else
      ERREXIT(cinfo, JERR_TGA_BADPARMS);
    TRACEMS2(cinfo, 1, JTRC_TGA_GRAY, width, height);
    break;
  default:
    ERREXIT(cinfo, JERR_TGA_BADPARMS);
    break;
  }

  if (is_bottom_up) {
    /* Create a virtual array to buffer the upside-down image. */
    source->whole_image = (*cinfo->mem->request_virt_sarray)
      ((j_common_ptr)cinfo, JPOOL_IMAGE, FALSE,
       (JDIMENSION)width * components, (JDIMENSION)height, (JDIMENSION)1);
    if (cinfo->progress != NULL) {
      cd_progress_ptr progress = (cd_progress_ptr)cinfo->progress;
      progress->total_extra_passes++; /* count file input as separate pass */
    }
    /* source->pub.buffer will point to the virtual array. */
    source->pub.buffer_height = 1; /* in case anyone looks at it */
    source->pub.get_pixel_rows = preload_image;
  } else {
    /* Don't need a virtual array, but do need a one-row input buffer. */
    source->whole_image = NULL;
    source->pub.buffer = (*cinfo->mem->alloc_sarray)
      ((j_common_ptr)cinfo, JPOOL_IMAGE,
       (JDIMENSION)width * components, (JDIMENSION)1);
    source->pub.buffer_height = 1;
    source->pub.get_pixel_rows = source->get_pixel_rows;
  }

  while (idlen--)               /* Throw away ID field */
    (void)read_byte(source);

  if (maplen > 0) {
    if (maplen > 256 || GET_2B(3) != 0)
      ERREXIT(cinfo, JERR_TGA_BADCMAP);
    /* Allocate space to store the colormap */
    source->colormap = (*cinfo->mem->alloc_sarray)
      ((j_common_ptr)cinfo, JPOOL_IMAGE, (JDIMENSION)maplen, (JDIMENSION)3);
    source->cmap_length = (int)maplen;
    /* and read it from the file */
    read_colormap(source, (int)maplen, UCH(targaheader[7]));
  } else {
    if (cmaptype)               /* but you promised a cmap! */
      ERREXIT(cinfo, JERR_TGA_BADPARMS);
    source->colormap = NULL;
    source->cmap_length = 0;
  }

  cinfo->input_components = components;
  cinfo->data_precision = 8;
  cinfo->image_width = width;
  cinfo->image_height = height;
}